

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::Skip(EpsCopyOutputStream *this,int count,uint8_t **pp)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint8_t *puVar6;
  int iVar7;
  int size;
  void *data;
  int local_44;
  uint8_t **local_40;
  uint8_t *local_38;
  
  if (-1 < count) {
    if ((this->had_error_ != true) && (local_44 = Flush(this,*pp), this->had_error_ != true)) {
      local_38 = this->buffer_end_;
      local_40 = pp;
      do {
        iVar7 = count - local_44;
        bVar2 = count < local_44;
        if (iVar7 == 0 || count < local_44) {
          local_38 = local_38 + count;
          uVar5 = local_44 - count;
          puVar6 = (uint8_t *)0x0;
          puVar1 = local_38 + ((ulong)uVar5 - 0x10);
          puVar4 = local_38;
          if ((int)uVar5 < 0x11) {
            puVar4 = this->buffer_;
            puVar1 = this->buffer_ + (int)uVar5;
            puVar6 = local_38;
          }
          this->end_ = puVar1;
          this->buffer_end_ = puVar6;
          goto LAB_001f8621;
        }
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_44);
        count = iVar7;
      } while ((char)iVar3 != '\0');
      this->had_error_ = true;
      puVar4 = this->buffer_;
      this->end_ = this->buffer_ + 0x10;
LAB_001f8621:
      *local_40 = puVar4;
      return iVar7 == 0 || bVar2;
    }
    *pp = this->buffer_;
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::Skip(int count, uint8_t** pp) {
  if (count < 0) return false;
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  int size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  void* data = buffer_end_;
  while (count > size) {
    count -= size;
    if (!stream_->Next(&data, &size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(static_cast<uint8_t*>(data) + count, size - count);
  return true;
}